

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconstruction.cpp
# Opt level: O3

void finalize(Mat *result,Mat *ocount)

{
  int iVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long *in_RDX;
  long lVar6;
  long lVar7;
  
  iVar1 = *(int *)(result + 8);
  if (0 < (long)iVar1) {
    lVar5 = *(long *)(result + 0x10);
    lVar3 = **(long **)(result + 0x48);
    lVar4 = *in_RDX;
    iVar2 = *(int *)(result + 0xc);
    lVar6 = 0;
    do {
      if (0 < iVar2) {
        lVar7 = 0;
        do {
          if (0.0 < *(float *)(ocount + lVar7 * 4)) {
            *(float *)(lVar5 + lVar7 * 4) =
                 *(float *)(lVar5 + lVar7 * 4) / *(float *)(ocount + lVar7 * 4);
          }
          lVar7 = lVar7 + 1;
        } while (iVar2 != (int)lVar7);
      }
      lVar6 = lVar6 + 1;
      ocount = ocount + lVar4;
      lVar5 = lVar5 + lVar3;
    } while (lVar6 != iVar1);
  }
  return;
}

Assistant:

static
void finalize(cv::Mat &result, cv::Mat const &ocount)
{
#ifdef WITH_DISPATCH
  dispatch_queue_t queue = dispatch_get_global_queue(DISPATCH_QUEUE_PRIORITY_HIGH, 0);
  dispatch_apply(result.rows, queue,
                 ^(size_t y) {
                   float* p_res = result.ptr<float>(y);
                   float const* p_count = ocount.ptr<float>(y);
                   
                   for (int x = 0; x < result.cols; ++x, ++p_res, ++p_count)
                     if ( *p_count > 0.0 )
                       *p_res /= *p_count;
                 });
#else
  for (int y = 0; y < result.rows; ++y)
  {
    float* p_res = result.ptr<float>(y);
    float const* p_count = ocount.ptr<float>(y);

    for (int x = 0; x < result.cols; ++x, ++p_res, ++p_count)
      if ( *p_count > 0.0 )
        *p_res /= *p_count;
  }
#endif
}